

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int s_mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  mp_int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int i;
  mp_digit *tmpc;
  mp_digit *tmpb;
  mp_digit *tmpa;
  mp_digit u;
  int max;
  int min;
  int res;
  int olduse;
  mp_int *x;
  int in_stack_ffffffffffffffa4;
  int iVar2;
  mp_int *in_stack_ffffffffffffffa8;
  ulong *puVar3;
  long *local_50;
  long *local_48;
  ulong local_40;
  int local_38;
  int local_34;
  int *local_28;
  int local_4;
  
  if (*in_RSI < *in_RDI) {
    local_34 = *in_RSI;
    local_38 = *in_RDI;
    local_28 = in_RDI;
  }
  else {
    local_34 = *in_RDI;
    local_38 = *in_RSI;
    local_28 = in_RSI;
  }
  if ((local_38 + 1 <= in_RDX->alloc) ||
     (local_4 = mp_grow(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4), local_4 == 0)) {
    iVar1 = in_RDX->used;
    in_RDX->used = local_38 + 1;
    local_40 = 0;
    puVar3 = in_RDX->dp;
    local_50 = *(long **)(in_RSI + 4);
    local_48 = *(long **)(in_RDI + 4);
    for (iVar2 = 0; iVar2 < local_34; iVar2 = iVar2 + 1) {
      *puVar3 = *local_48 + *local_50 + local_40;
      local_40 = *puVar3 >> 0x3c;
      *puVar3 = *puVar3 & 0xfffffffffffffff;
      puVar3 = puVar3 + 1;
      local_50 = local_50 + 1;
      local_48 = local_48 + 1;
    }
    if (local_34 != local_38) {
      for (; iVar2 < local_38; iVar2 = iVar2 + 1) {
        *puVar3 = *(long *)(*(long *)(local_28 + 4) + (long)iVar2 * 8) + local_40;
        local_40 = *puVar3 >> 0x3c;
        *puVar3 = *puVar3 & 0xfffffffffffffff;
        puVar3 = puVar3 + 1;
      }
    }
    *puVar3 = local_40;
    for (iVar2 = in_RDX->used; puVar3 = puVar3 + 1, iVar2 < iVar1; iVar2 = iVar2 + 1) {
      *puVar3 = 0;
    }
    mp_clamp(in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int s_mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int *x;
  int     olduse, res, min, max;

  /* find sizes, we let |a| <= |b| which means we have to sort
   * them.  "x" will point to the input with the most digits
   */
  if (a->used > b->used) {
    min = b->used;
    max = a->used;
    x = a;
  } else {
    min = a->used;
    max = b->used;
    x = b;
  }

  /* init result */
  if (c->alloc < max + 1) {
    if ((res = mp_grow (c, max + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* get old used digit count and set new one */
  olduse = c->used;
  c->used = max + 1;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */

    /* first input */
    tmpa = a->dp;

    /* second input */
    tmpb = b->dp;

    /* destination */
    tmpc = c->dp;

    /* zero the carry */
    u = 0;
    for (i = 0; i < min; i++) {
      /* Compute the sum at one digit, T[i] = A[i] + B[i] + U */
      *tmpc = *tmpa++ + *tmpb++ + u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)DIGIT_BIT);

      /* take away carry bit from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, that is in A+B 
     * if A or B has more digits add those in 
     */
    if (min != max) {
      for (; i < max; i++) {
        /* T[i] = X[i] + U */
        *tmpc = x->dp[i] + u;

        /* U = carry bit of T[i] */
        u = *tmpc >> ((mp_digit)DIGIT_BIT);

        /* take away carry bit from T[i] */
        *tmpc++ &= MP_MASK;
      }
    }

    /* add carry */
    *tmpc++ = u;

    /* clear digits above oldused */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}